

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O3

void __thiscall
TPZEulerAnalysis::UpdateSolAndRhs<double>
          (TPZEulerAnalysis *this,TPZFMatrix<double> *deltaSol,REAL *epsilon)

{
  TPZSolutionMatrix *this_00;
  TPZFMatrix<std::complex<double>_> *pTVar1;
  ESolType EVar2;
  TPZFMatrix<double> *pTVar3;
  TPZFMatrix<double> *pTVar4;
  TPZSolutionMatrix *residual;
  double dVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double extraout_XMM0_Qa_00;
  REAL RVar7;
  
  this_00 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
  pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
  dVar6 = *epsilon;
  TPZFMatrix<double>::operator+=(pTVar3,&deltaSol->super_TPZMatrix<double>);
  TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x22])(this)
  ;
  EVar2 = (this->super_TPZLinearAnalysis).fRhs.fSolType;
  if (EVar2 == EComplex) {
    pTVar1 = &(this->super_TPZLinearAnalysis).fRhs.fComplexMatrix;
    Dot<std::complex<double>>(pTVar1,pTVar1);
    dVar5 = extraout_XMM0_Qa;
  }
  else {
    if (EVar2 != EReal) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                 ,0x98);
    }
    pTVar4 = &(this->super_TPZLinearAnalysis).fRhs.fRealMatrix;
    dVar5 = Dot<double>(pTVar4,pTVar4);
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  *epsilon = dVar5;
  if (dVar6 < dVar5) {
    TPZFMatrix<double>::operator-=(pTVar3,&deltaSol->super_TPZMatrix<double>);
    residual = this_00;
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    LineSearch(this,(REAL *)residual,pTVar4,deltaSol);
    TPZFMatrix<double>::operator+=(pTVar3,&deltaSol->super_TPZMatrix<double>);
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    EVar2 = (this->super_TPZLinearAnalysis).fRhs.fSolType;
    if (EVar2 == EComplex) {
      pTVar1 = &(this->super_TPZLinearAnalysis).fRhs.fComplexMatrix;
      Dot<std::complex<double>>(pTVar1,pTVar1);
      dVar6 = extraout_XMM0_Qa_00;
    }
    else {
      if (EVar2 != EReal) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                   ,0x98);
      }
      pTVar3 = &(this->super_TPZLinearAnalysis).fRhs.fRealMatrix;
      dVar6 = Dot<double>(pTVar3,pTVar3);
    }
    if (dVar6 < 0.0) {
      RVar7 = sqrt(dVar6);
    }
    else {
      RVar7 = SQRT(dVar6);
    }
    *epsilon = RVar7;
  }
  return;
}

Assistant:

void TPZEulerAnalysis::UpdateSolAndRhs(TPZFMatrix<TVar> & deltaSol, REAL & epsilon)
{
	TPZFMatrix<TVar> &sol = fSolution;
    REAL initEpsilon = epsilon;
    int outofrange = 0;
    try
    {
        sol += deltaSol;
        fCompMesh->LoadSolution(fSolution);
        AssembleRhs();
        epsilon = Norm(fRhs);
    }
	catch(...)
	{
		outofrange = 1;
		sol -= deltaSol;
		epsilon = initEpsilon;
		fCompMesh->LoadSolution(fSolution);
	}
	
    if(epsilon > initEpsilon)
    {
		sol -= deltaSol;
		fCompMesh->LoadSolution(fSolution);
		/*int resultlin = */
		LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
    }
	
    if(outofrange)
    {
		/*int resultlin = */LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
		fFlowCompMesh->ScaleCFL(.5);
    }
}